

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O1

void deflate(nghttp2_hd_deflater *deflater,nghttp2_hd_inflater *inflater,nghttp2_nv *nva,
            size_t nvlen)

{
  nghttp2_nv *pnVar1;
  char cVar2;
  size_t *psVar3;
  size_t __size;
  void *__ptr;
  llhttp__internal_t *state;
  size_t sVar4;
  void *extraout_RDX;
  uint8_t uVar5;
  long lVar6;
  llhttp__internal_t *plVar7;
  void *pvVar8;
  double dVar9;
  undefined1 auVar10 [16];
  int inflate_flags;
  nghttp2_nv nv;
  uint local_6c;
  nghttp2_nv *local_68;
  size_t local_60;
  undefined1 local_58 [40];
  
  if (nvlen == 0) {
    lVar6 = 0;
  }
  else {
    psVar3 = &nva->valuelen;
    lVar6 = 0;
    sVar4 = nvlen;
    do {
      lVar6 = lVar6 + psVar3[-1] + *psVar3;
      psVar3 = psVar3 + 5;
      sVar4 = sVar4 - 1;
    } while (sVar4 != 0);
  }
  local_68 = nva;
  printf("Input (%zu byte(s)):\n\n",lVar6);
  local_60 = nvlen;
  if (nvlen != 0) {
    psVar3 = &local_68->valuelen;
    do {
      fwrite(((nghttp2_nv *)(psVar3 + -3))->name,1,psVar3[-1],_stdout);
      printf(": ");
      fwrite((uint8_t *)psVar3[-2],1,*psVar3,_stdout);
      putchar(10);
      psVar3 = psVar3 + 5;
      nvlen = nvlen - 1;
    } while (nvlen != 0);
  }
  sVar4 = local_60;
  pnVar1 = local_68;
  __size = nghttp2_hd_deflate_bound(deflater,local_68,local_60);
  __ptr = malloc(__size);
  state = (llhttp__internal_t *)nghttp2_hd_deflate_hd2(deflater,__ptr,__size,pnVar1,sVar4);
  if ((long)state < 0) {
    uVar5 = (uint8_t)__ptr;
    deflate_cold_2();
    llhttp__internal_init(state);
    state->type = uVar5;
    state->settings = extraout_RDX;
    return;
  }
  dVar9 = 0.0;
  if (lVar6 != 0) {
    auVar10._8_4_ = (int)((ulong)lVar6 >> 0x20);
    auVar10._0_8_ = lVar6;
    auVar10._12_4_ = 0x45300000;
    dVar9 = (double)(long)state /
            ((auVar10._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0));
  }
  printf("\nDeflate (%zu byte(s), ratio %.02f):\n\n",dVar9,state);
  if (state != (llhttp__internal_t *)0x0) {
    plVar7 = (llhttp__internal_t *)0x0;
    do {
      if (((ulong)plVar7 & 0xf) == 0) {
        printf("%08zX: ",plVar7);
      }
      printf("%02X ",(ulong)*(byte *)((long)__ptr + (long)plVar7));
      plVar7 = (llhttp__internal_t *)((long)&plVar7->_index + 1);
      if (((ulong)plVar7 & 0xf) == 0) {
        putchar(10);
      }
    } while (state != plVar7);
  }
  puts("\n\nInflate:\n");
  pvVar8 = __ptr;
  do {
    local_6c = 0;
    lVar6 = nghttp2_hd_inflate_hd3(inflater,local_58,&local_6c,pvVar8,state,1);
    if (lVar6 < 0) {
      fprintf(_stderr,"inflate failed with error code %td",lVar6);
      cVar2 = '\x01';
    }
    else {
      if ((local_6c & 2) != 0) {
        deflate_cold_1();
      }
      pvVar8 = (void *)((long)pvVar8 + lVar6);
      state = (llhttp__internal_t *)((long)state - lVar6);
      if ((local_6c & 1) == 0) {
        cVar2 = (state == (llhttp__internal_t *)0x0 && (local_6c & 2) == 0) * '\x02';
      }
      else {
        nghttp2_hd_inflate_end_headers(inflater);
        cVar2 = '\x02';
      }
    }
  } while (cVar2 == '\0');
  if (cVar2 != '\x02') {
    free(__ptr);
    exit(1);
  }
  puts("\n-------------------------------------------------------------------------------");
  free(__ptr);
  return;
}

Assistant:

static void deflate(nghttp2_hd_deflater *deflater,
                    nghttp2_hd_inflater *inflater, const nghttp2_nv *const nva,
                    size_t nvlen) {
  nghttp2_ssize rv;
  uint8_t *buf;
  size_t buflen;
  size_t outlen;
  size_t i;
  size_t sum;

  sum = 0;

  for (i = 0; i < nvlen; ++i) {
    sum += nva[i].namelen + nva[i].valuelen;
  }

  printf("Input (%zu byte(s)):\n\n", sum);

  for (i = 0; i < nvlen; ++i) {
    fwrite(nva[i].name, 1, nva[i].namelen, stdout);
    printf(": ");
    fwrite(nva[i].value, 1, nva[i].valuelen, stdout);
    printf("\n");
  }

  buflen = nghttp2_hd_deflate_bound(deflater, nva, nvlen);
  buf = malloc(buflen);

  rv = nghttp2_hd_deflate_hd2(deflater, buf, buflen, nva, nvlen);

  if (rv < 0) {
    fprintf(stderr, "nghttp2_hd_deflate_hd2() failed with error: %s\n",
            nghttp2_strerror((int)rv));

    free(buf);

    exit(EXIT_FAILURE);
  }

  outlen = (size_t)rv;

  printf("\nDeflate (%zu byte(s), ratio %.02f):\n\n", outlen,
         sum == 0 ? 0 : (double)outlen / (double)sum);

  for (i = 0; i < outlen; ++i) {
    if ((i & 0x0fu) == 0) {
      printf("%08zX: ", i);
    }

    printf("%02X ", buf[i]);

    if (((i + 1) & 0x0fu) == 0) {
      printf("\n");
    }
  }

  printf("\n\nInflate:\n\n");

  /* We pass 1 to final parameter, because buf contains whole deflated
     header data. */
  rv = inflate_header_block(inflater, buf, outlen, 1);

  if (rv != 0) {
    free(buf);

    exit(EXIT_FAILURE);
  }

  printf("\n-----------------------------------------------------------"
         "--------------------\n");

  free(buf);
}